

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O1

void __thiscall
Assimp::AMFImporter::Postprocess_AddMetadata
          (AMFImporter *this,
          list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
          *metadataList,aiNode *sceneNode)

{
  _List_node_base *p_Var1;
  aiMetadata *paVar2;
  aiString *paVar3;
  aiMetadataEntry *__s;
  runtime_error *this_00;
  uint uVar4;
  ulong uVar5;
  aiString *paVar6;
  CAMFImporter_NodeElement local_c0;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  if ((metadataList->
      super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
      )._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)metadataList) {
    if (sceneNode->mMetaData != (aiMetadata *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_c0._vptr_CAMFImporter_NodeElement = (_func_int **)&local_c0.ID;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,
                 "Postprocess. MetaData member in node are not nullptr. Something went wrong.","");
      std::runtime_error::runtime_error(this_00,(string *)&local_c0);
      *(undefined ***)this_00 = &PTR__runtime_error_0082bce0;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar5 = (metadataList->
            super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
            )._M_impl._M_node._M_size;
    uVar4 = (uint)uVar5;
    if (uVar4 == 0) {
      paVar2 = (aiMetadata *)0x0;
    }
    else {
      uVar5 = uVar5 & 0xffffffff;
      paVar2 = (aiMetadata *)operator_new(0x18);
      paVar2->mKeys = (aiString *)0x0;
      paVar2->mValues = (aiMetadataEntry *)0x0;
      paVar2->mNumProperties = uVar4;
      paVar3 = (aiString *)operator_new__(uVar5 * 0x404);
      paVar6 = paVar3;
      do {
        paVar6->length = 0;
        paVar6->data[0] = '\0';
        memset(paVar6->data + 1,0x1b,0x3ff);
        paVar6 = paVar6 + 1;
      } while (paVar6 != paVar3 + uVar5);
      paVar2->mKeys = paVar3;
      uVar5 = (ulong)paVar2->mNumProperties << 4;
      __s = (aiMetadataEntry *)operator_new__(uVar5);
      memset(__s,0,uVar5);
      paVar2->mValues = __s;
    }
    sceneNode->mMetaData = paVar2;
    for (p_Var1 = (metadataList->
                  super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
        p_Var1 != (_List_node_base *)metadataList; p_Var1 = p_Var1->_M_next) {
      local_70 = local_60;
      local_50 = local_40;
      local_c0.Parent =
           (CAMFImporter_NodeElement *)((_List_node_base *)((long)p_Var1 + 0x10))->_M_next;
      local_c0.ID._M_dataplus._M_p = (pointer)&local_c0.ID.field_2;
      local_c0.Child.
      super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_c0.Child;
      local_40[0] = 0;
      local_48 = 0;
      local_60[0] = 0;
      local_68 = 0;
      local_c0.Child.
      super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>.
      _M_impl._M_node._M_size = 0;
      local_c0.ID.field_2._M_local_buf[0] = '\0';
      local_c0.ID._M_string_length = 0;
      local_c0.Type = ENET_Metadata;
      local_c0._vptr_CAMFImporter_NodeElement =
           (_func_int **)&PTR__CAMFImporter_NodeElement_Metadata_0082e260;
      local_c0.Child.
      super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>.
      _M_impl._M_node.super__List_node_base._M_prev =
           local_c0.Child.
           super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
      CAMFImporter_NodeElement::~CAMFImporter_NodeElement(&local_c0);
    }
  }
  return;
}

Assistant:

void AMFImporter::Postprocess_AddMetadata(const std::list<CAMFImporter_NodeElement_Metadata*>& metadataList, aiNode& sceneNode) const
{
	if ( !metadataList.empty() )
	{
		if(sceneNode.mMetaData != nullptr) throw DeadlyImportError("Postprocess. MetaData member in node are not nullptr. Something went wrong.");

		// copy collected metadata to output node.
        sceneNode.mMetaData = aiMetadata::Alloc( static_cast<unsigned int>(metadataList.size()) );
		size_t meta_idx( 0 );

		for(const CAMFImporter_NodeElement_Metadata& metadata: metadataList)
		{
			sceneNode.mMetaData->Set(static_cast<unsigned int>(meta_idx++), metadata.Type, aiString(metadata.Value));
		}
	}// if(!metadataList.empty())
}